

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * linearize_expression(Proc *proc,AstNode *expr)

{
  Proc *local_28;
  Pseudo *result;
  AstNode *expr_local;
  Proc *proc_local;
  
  local_28 = (Proc *)0x0;
  switch(expr->type) {
  case EXPR_LITERAL:
    local_28 = (Proc *)linearize_literal(proc,expr);
    break;
  case EXPR_SYMBOL:
    local_28 = (Proc *)linearize_symbol_expression(proc,expr);
    break;
  case EXPR_Y_INDEX:
  case EXPR_FIELD_SELECTOR:
    local_28 = (Proc *)linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    break;
  default:
    handle_error(proc->linearizer->compiler_state,"feature not yet implemented");
    break;
  case EXPR_SUFFIXED:
    local_28 = (Proc *)linearize_suffixedexpr(proc,expr);
    break;
  case EXPR_UNARY:
    local_28 = (Proc *)linearize_unary_operator(proc,expr);
    break;
  case EXPR_BINARY:
    local_28 = (Proc *)linearize_binary_operator(proc,expr);
    break;
  case EXPR_FUNCTION:
    local_28 = (Proc *)linearize_function_expr(proc,expr);
    break;
  case EXPR_TABLE_LITERAL:
    local_28 = (Proc *)linearize_table_constructor(proc,expr);
    break;
  case EXPR_CONCAT:
    local_28 = (Proc *)linearize_concat_expression(proc,expr);
    break;
  case EXPR_BUILTIN:
    local_28 = (Proc *)linearize_builtin_expression(proc,expr);
  }
  if (local_28 != (Proc *)0x0) {
    check_pseudo_is_top(proc,(Pseudo *)local_28);
    if (((local_28->node_count & 0xf) == 0xb) &&
       (((expr->field_2).embedded_C_stmt.is_decl & 1U) != 0)) {
      proc_local = (Proc *)convert_range_to_temp((Pseudo *)local_28);
    }
    else {
      proc_local = local_28;
    }
    return (Pseudo *)proc_local;
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x7e3,"Pseudo *linearize_expression(Proc *, AstNode *)");
}

Assistant:

static Pseudo *linearize_expression(Proc *proc, AstNode *expr)
{
	Pseudo *result = NULL;
	switch (expr->type) {
	case EXPR_LITERAL: {
		result = linearize_literal(proc, expr);
	} break;
	case EXPR_BINARY: {
		result = linearize_binary_operator(proc, expr);
	} break;
	case EXPR_FUNCTION: {
		result = linearize_function_expr(proc, expr);
	} break;
	case EXPR_UNARY: {
		result = linearize_unary_operator(proc, expr);
	} break;
	case EXPR_SUFFIXED: {
		result = linearize_suffixedexpr(proc, expr);
	} break;
	case EXPR_SYMBOL: {
		result = linearize_symbol_expression(proc, expr);
	} break;
	case EXPR_TABLE_LITERAL: {
		result = linearize_table_constructor(proc, expr);
	} break;
	case EXPR_Y_INDEX:
	case EXPR_FIELD_SELECTOR: {
		result = linearize_expression(proc, expr->index_expr.expr);
	} break;
	case EXPR_CONCAT: {
		result = linearize_concat_expression(proc, expr);
	} break;
	case EXPR_BUILTIN: {
		result = linearize_builtin_expression(proc, expr);
	} break;
	default:
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		break;
	}
	assert(result);
	check_pseudo_is_top(proc, result);
	if (result->type == PSEUDO_RANGE && expr->common_expr.truncate_results) {
		// Need to truncate the results to 1
		return convert_range_to_temp(result);
	}
	return result;
}